

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

value_type __thiscall
jsoncons::jsonpath::detail::
contains_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(contains_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  char *pcVar1;
  long lVar2;
  json_type jVar3;
  type_conflict9 tVar4;
  bool bVar5;
  iterator lhs;
  size_type sVar6;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar7;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  array_range_type aVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  value_type vVar11;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg0;
  type sv0;
  
  pcVar1 = *(char **)ec;
  if ((pointer)(((long)ec->_M_cat - (long)pcVar1) / 0x18) !=
      (args->
      super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar7);
    uVar8 = extraout_RDX;
    goto LAB_0036becc;
  }
  if (*pcVar1 == '\0') {
    pbVar7 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              (pcVar1 + 8);
  }
  else {
    pbVar7 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             (pcVar1 + 8);
  }
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
            (&arg0,pbVar7);
  lVar2 = *(long *)ec;
  if (*(char *)(lVar2 + 0x18) == '\0') {
    pbVar7 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              (lVar2 + 0x20);
  }
  else {
    pbVar7 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             (lVar2 + 0x20);
  }
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
            (&arg1,pbVar7);
  jVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type(&arg0);
  if (jVar3 == string_value) {
    bVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_string
                      (&arg1);
    if (!bVar5) goto LAB_0036be92;
    sv0 = json_type_traits<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_void>
          ::as(&arg0);
    bVar10 = json_type_traits<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_void>
             ::as(&arg1);
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (&sv0,bVar10._M_str,0,bVar10._M_len);
    *(undefined2 *)
     &(this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      )._vptr_function_base = 1;
    *(bool *)((long)&(this->
                     super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     )._vptr_function_base + 2) = sVar6 != 0xffffffffffffffff;
  }
  else if (jVar3 == array_value) {
    aVar9 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::array_range
                      (&arg0);
    lhs = aVar9.first_._M_current;
    do {
      if (lhs._M_current == aVar9.last_._M_current._M_current) {
        *(undefined2 *)
         &(this->
          super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          )._vptr_function_base = 1;
        *(undefined1 *)
         ((long)&(this->
                 super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 )._vptr_function_base + 2) = 0;
        goto LAB_0036beb8;
      }
      tVar4 = jsoncons::operator==(lhs._M_current,&arg1);
      lhs._M_current = lhs._M_current + 1;
    } while (!tVar4);
    *(undefined2 *)
     &(this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      )._vptr_function_base = 1;
    *(undefined1 *)
     ((long)&(this->
             super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             )._vptr_function_base + 2) = 1;
  }
  else {
LAB_0036be92:
    std::error_code::operator=(in_RCX,invalid_type);
    pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar7);
  }
LAB_0036beb8:
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json(&arg1);
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json(&arg0);
  uVar8 = extraout_RDX_00;
LAB_0036becc:
  vVar11.field_0.int64_.val_ = uVar8;
  vVar11.field_0._0_8_ = this;
  return (value_type)vVar11.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            auto arg1= args[1].value();

            switch (arg0.type())
            {
                case json_type::array_value:
                    for (auto& j : arg0.array_range())
                    {
                        if (j == arg1)
                        {
                            return value_type(true, semantic_tag::none);
                        }
                    }
                    return value_type(false, semantic_tag::none);
                case json_type::string_value:
                {
                    if (!arg1.is_string())
                    {
                        ec = jsonpath_errc::invalid_type;
                        return value_type::null();
                    }
                    auto sv0 = arg0.template as<string_view_type>();
                    auto sv1 = arg1.template as<string_view_type>();
                    return sv0.find(sv1) != string_view_type::npos ? value_type(true, semantic_tag::none) : value_type(false, semantic_tag::none);
                }
                default:
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
            }
        }